

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O3

void soul::SanityCheckPass::RecursiveGraphDetector::check(Graph *g,RecursiveGraphDetector *stack)

{
  pointer ppVar1;
  Expression *pEVar2;
  RecursiveGraphDetector **ppRVar3;
  Identifier *pIVar4;
  RecursiveGraphDetector *pRVar5;
  long lVar6;
  Graph *g_00;
  pointer ppVar7;
  RecursiveGraphDetector newStack;
  vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  modulesFound;
  RecursiveGraphDetector local_128;
  IdentifierPath local_118;
  IdentifierPath local_c0;
  CompileMessage local_68;
  
  pRVar5 = stack;
  if (stack != (RecursiveGraphDetector *)0x0) {
    do {
      if (pRVar5->graph == g) {
        (*(g->super_ProcessorBase).super_ModuleBase.super_ASTObject._vptr_ASTObject[0xd])
                  (&local_c0,g);
        CompileMessageHelpers::createMessage<soul::IdentifierPath>
                  (&local_68,syntax,error,"Recursively nested types within $Q0$",&local_c0);
        AST::Context::throwError
                  (&(g->super_ProcessorBase).super_ModuleBase.super_ASTObject.context,&local_68,
                   false);
      }
      ppRVar3 = &pRVar5->previous;
      pRVar5 = *ppRVar3;
    } while (*ppRVar3 != (RecursiveGraphDetector *)0x0);
  }
  ppVar7 = (g->processorInstances).
           super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (g->processorInstances).
           super__Vector_base<soul::pool_ref<soul::AST::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar7 != ppVar1) {
    local_128.previous = stack;
    local_128.graph = g;
    do {
      pEVar2 = (ppVar7->object->targetProcessor).object;
      if (pEVar2 != (Expression *)0x0) {
        lVar6 = __dynamic_cast(pEVar2,&AST::Expression::typeinfo,&AST::ProcessorRef::typeinfo,0);
        if (lVar6 == 0) {
          lVar6 = __dynamic_cast(pEVar2,&AST::Expression::typeinfo,
                                 &AST::QualifiedIdentifier::typeinfo,0);
          if (lVar6 == 0) goto LAB_001f4f7f;
          IdentifierPath::operator+
                    (&local_118,(IdentifierPath *)(lVar6 + 0x48),*(IdentifierPath **)(lVar6 + 0x30))
          ;
          AST::Scope::getMatchingSubModules
                    ((vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                      *)&local_c0,&(g->super_ProcessorBase).super_ModuleBase.super_Scope,&local_118)
          ;
          local_118.pathSections.numActive = 0;
          if (8 < local_118.pathSections.numAllocated) {
            if (local_118.pathSections.items != (Identifier *)0x0) {
              operator_delete__(local_118.pathSections.items);
            }
            local_118.pathSections.items = (Identifier *)local_118.pathSections.space;
            local_118.pathSections.numAllocated = 8;
          }
          pIVar4 = local_c0.pathSections.items;
          if (local_c0.pathSections.numActive - (long)local_c0.pathSections.items == 8) {
            if ((local_c0.pathSections.items)->name == (string *)0x0) {
              g_00 = (Graph *)0x0;
            }
            else {
              g_00 = (Graph *)__dynamic_cast((local_c0.pathSections.items)->name,
                                             &AST::ModuleBase::typeinfo,&AST::Graph::typeinfo,0);
            }
          }
          else {
            g_00 = (Graph *)0x0;
            if (local_c0.pathSections.items == (Identifier *)0x0) goto LAB_001f4f7a;
          }
          operator_delete(pIVar4,local_c0.pathSections.numAllocated - (long)pIVar4);
        }
        else {
          g_00 = (Graph *)__dynamic_cast(*(undefined8 *)(lVar6 + 0x30),&AST::ProcessorBase::typeinfo
                                         ,&AST::Graph::typeinfo,0);
        }
LAB_001f4f7a:
        if (g_00 != (Graph *)0x0) {
          check(g_00,&local_128);
          return;
        }
      }
LAB_001f4f7f:
      ppVar7 = ppVar7 + 1;
    } while (ppVar7 != ppVar1);
  }
  return;
}

Assistant:

static void check (AST::Graph& g, const RecursiveGraphDetector* stack = nullptr)
        {
            for (auto s = stack; s != nullptr; s = s->previous)
                if (s->graph == std::addressof (g))
                    g.context.throwError (Errors::recursiveTypes (g.getFullyQualifiedPath()));

            const RecursiveGraphDetector newStack { stack, std::addressof (g) };

            for (auto& p : g.processorInstances)
            {
                // avoid using findSingleMatchingSubModule() as we don't want an error thrown if
                // a processor specialisation alias has not yet been resolved

                pool_ptr<AST::Graph> sub;

                if (auto pr = cast<AST::ProcessorRef> (p->targetProcessor))
                {
                    sub = cast<AST::Graph> (pr->processor);
                }
                else if (auto name = cast<AST::QualifiedIdentifier> (p->targetProcessor))
                {
                    auto modulesFound = g.getMatchingSubModules (name->getPath());

                    if (modulesFound.size() == 1)
                        sub = cast<AST::Graph> (modulesFound.front());
                }

                if (sub != nullptr)
                    return check (*sub, std::addressof (newStack));
            }
        }